

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

void __thiscall Json::StyledWriter::writeValue(StyledWriter *this,Value *value)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  bool bVar4;
  Value *pVVar5;
  uint uVar6;
  LargestUInt value_00;
  char *value_01;
  LargestInt value_02;
  Value *root;
  char *pcVar7;
  pointer pbVar8;
  Json *pJVar9;
  double value_03;
  Members members;
  string local_68;
  Members local_48;
  
  bVar3 = (byte)*(ushort *)&value->field_0x8;
  if (7 < bVar3) {
    return;
  }
  uVar6 = (uint)((long)&switchD_001171cb::switchdataD_0011fca4 +
                (long)(int)(&switchD_001171cb::switchdataD_0011fca4)[bVar3]);
  switch(bVar3) {
  case 0:
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"null","");
    pushValue(this,&local_68);
    goto LAB_001174ce;
  case 1:
    pJVar9 = (Json *)Value::asInt64(value);
    valueToString_abi_cxx11_(&local_68,pJVar9,value_02);
    pushValue(this,&local_68);
    break;
  case 2:
    pJVar9 = (Json *)Value::asUInt64(value);
    valueToString_abi_cxx11_(&local_68,pJVar9,value_00);
    pushValue(this,&local_68);
    break;
  case 3:
    value_03 = Value::asDouble(value);
    valueToString_abi_cxx11_(&local_68,(Json *)0x0,value_03,true,uVar6);
    pushValue(this,&local_68);
    break;
  case 4:
    uVar6 = (uint)CONCAT71((int7)((ulong)((long)&switchD_001171cb::switchdataD_0011fca4 +
                                         (long)(int)(&switchD_001171cb::switchdataD_0011fca4)[bVar3]
                                         ) >> 8),bVar3 == 4);
    pJVar9 = (Json *)(value->value_).string_;
    if (pJVar9 != (Json *)0x0 && bVar3 == 4) {
      if ((*(ushort *)&value->field_0x8 >> 8 & 1) == 0) {
        pcVar7 = (char *)strlen((char *)pJVar9);
      }
      else {
        pcVar7 = (char *)(ulong)*(uint *)pJVar9;
        pJVar9 = pJVar9 + 4;
      }
      valueToQuotedStringN_abi_cxx11_(&local_68,pJVar9,pcVar7,uVar6);
      pushValue(this,&local_68);
      break;
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
    pushValue(this,&local_68);
LAB_001174ce:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return;
    }
    goto LAB_00117539;
  case 5:
    bVar4 = Value::asBool(value);
    pcVar7 = "false";
    if (bVar4) {
      pcVar7 = "true";
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,pcVar7,pcVar7 + ((ulong)bVar4 ^ 5));
    pushValue(this,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return;
    }
    goto LAB_00117539;
  case 6:
    writeArrayValue(this,value);
    return;
  case 7:
    Value::getMemberNames_abi_cxx11_(&local_48,value);
    paVar2 = &local_68.field_2;
    local_68._M_dataplus._M_p = (pointer)paVar2;
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"{}","");
      pushValue(this,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p == paVar2) goto LAB_00117499;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"{","");
      writeIndent(this);
      psVar1 = &this->document_;
      std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_68._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      indent(this);
      pbVar8 = local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        pcVar7 = (pbVar8->_M_dataplus)._M_p;
        pVVar5 = Value::find(value,pcVar7,pcVar7 + pbVar8->_M_string_length);
        root = (Value *)kNull;
        if (pVVar5 != (Value *)0x0) {
          root = pVVar5;
        }
        writeCommentBeforeValue(this,root);
        valueToQuotedString_abi_cxx11_(&local_68,(Json *)(pbVar8->_M_dataplus)._M_p,value_01);
        writeIndent(this);
        std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_68._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        std::__cxx11::string::append((char *)psVar1);
        writeValue(this,root);
        pbVar8 = pbVar8 + 1;
        if (pbVar8 == local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) break;
        std::__cxx11::string::push_back((char)psVar1);
        writeCommentAfterValueOnSameLine(this,root);
      }
      writeCommentAfterValueOnSameLine(this,root);
      unindent(this);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"}","");
      writeIndent(this);
      std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_68._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p == &local_68.field_2) goto LAB_00117499;
    }
    operator_delete(local_68._M_dataplus._M_p);
LAB_00117499:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    return;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
LAB_00117539:
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

void StyledWriter::writeValue(const Value& value) {
  switch (value.type()) {
  case nullValue:
    pushValue("null");
    break;
  case intValue:
    pushValue(valueToString(value.asLargestInt()));
    break;
  case uintValue:
    pushValue(valueToString(value.asLargestUInt()));
    break;
  case realValue:
    pushValue(valueToString(value.asDouble()));
    break;
  case stringValue:
  {
    // Is NULL possible for value.string_?
    char const* str;
    char const* end;
    bool ok = value.getString(&str, &end);
    if (ok) pushValue(valueToQuotedStringN(str, static_cast<unsigned>(end-str)));
    else pushValue("");
    break;
  }
  case booleanValue:
    pushValue(valueToString(value.asBool()));
    break;
  case arrayValue:
    writeArrayValue(value);
    break;
  case objectValue: {
    Value::Members members(value.getMemberNames());
    if (members.empty())
      pushValue("{}");
    else {
      writeWithIndent("{");
      indent();
      Value::Members::iterator it = members.begin();
      for (;;) {
        const JSONCPP_STRING& name = *it;
        const Value& childValue = value[name];
        writeCommentBeforeValue(childValue);
        writeWithIndent(valueToQuotedString(name.c_str()));
        document_ += " : ";
        writeValue(childValue);
        if (++it == members.end()) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        document_ += ',';
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("}");
    }
  } break;
  }
}